

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O0

int Sim_UtilMatrsAreDisjoint(Sym_Man_t *p)

{
  int iVar1;
  Extra_BitMat_t *p1;
  Extra_BitMat_t *p2;
  int local_1c;
  int i;
  Sym_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    if (p->nOutputs <= local_1c) {
      return 1;
    }
    p1 = (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrSymms,local_1c);
    p2 = (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrNonSymms,local_1c);
    iVar1 = Extra_BitMatrixIsDisjoint(p1,p2);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return 0;
}

Assistant:

int Sim_UtilMatrsAreDisjoint( Sym_Man_t * p )
{
    int i;
    for ( i = 0; i < p->nOutputs; i++ )
        if ( !Extra_BitMatrixIsDisjoint( (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrSymms,i), (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrNonSymms,i) ) )
            return 0;
    return 1;
}